

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  char **extraout_RDX;
  skiwi *this;
  skiwi_parameters local_80 [79];
  allocator<char> local_31;
  string local_30;
  undefined4 local_c;
  
  local_c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Game of life",&local_31);
  wh = create_window(&local_30,0x200,0x200);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  scm_randomize();
  skiwi::skiwi_parameters::skiwi_parameters(local_80);
  skiwi::scheme_with_skiwi(register_functions,0);
  this = (skiwi *)0x0;
  skiwi::skiwi_repl((skiwi *)0x0,0,extraout_RDX);
  skiwi::skiwi_quit(this);
  scm_stop();
  close_window(&wh);
  return 0;
}

Assistant:

int main()
  {  
  wh = create_window("Game of life", 512, 512); // create window for visualization
  scm_randomize(); // fill grid cells at random  
  skiwi::scheme_with_skiwi(&register_functions); // start scheme compiler skiwi
  skiwi::skiwi_repl(); // start the skiwi repl
  skiwi::skiwi_quit(); // clean up skiwi
  scm_stop(); // stop the game thread
  close_window(wh); // close the visualization window

  return 0;
  }